

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BondAngleDistribution.cpp
# Opt level: O1

void __thiscall
OpenMD::BondAngleDistribution::writeBondAngleDistribution(BondAngleDistribution *this)

{
  pointer pcVar1;
  char cVar2;
  ostream *poVar3;
  long lVar4;
  Revision r;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  ofstream ofs;
  Revision local_251;
  string local_250;
  double local_230;
  long local_228;
  filebuf local_220 [240];
  ios_base local_130 [264];
  
  local_230 = (double)this->nTotBonds_;
  std::ofstream::ofstream
            (&local_228,(this->super_StaticAnalyser).outputFilename_._M_dataplus._M_p,_S_out);
  cVar2 = std::__basic_file<char>::is_open();
  if (cVar2 == '\0') {
    pcVar1 = (this->super_StaticAnalyser).outputFilename_._M_dataplus._M_p;
    local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_250,pcVar1,
               pcVar1 + (this->super_StaticAnalyser).outputFilename_._M_string_length);
    std::__cxx11::string::append((char *)&local_250);
    snprintf(painCave.errMsg,2000,"BondAngleDistribution: unable to open %s\n",
             local_250._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != &local_250.field_2) {
      operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
    }
    painCave.isFatal = 1;
    simError();
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_228,"# ",2);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_228,
                        (this->super_StaticAnalyser).analysisType_._M_dataplus._M_p,
                        (this->super_StaticAnalyser).analysisType_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_228,"# OpenMD ",9);
    Revision::getFullRevision_abi_cxx11_(&local_250,&local_251);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_228,local_250._M_dataplus._M_p,local_250._M_string_length)
    ;
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != &local_250.field_2) {
      operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_228,"# ",2);
    Revision::getBuildDate_abi_cxx11_(&local_250,&local_251);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_228,local_250._M_dataplus._M_p,local_250._M_string_length)
    ;
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != &local_250.field_2) {
      operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_228,"# selection script: \"",0x15);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_228,(this->selectionScript_)._M_dataplus._M_p,
                        (this->selectionScript_)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\"\n",2);
    if ((this->super_StaticAnalyser).paramString_._M_string_length != 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_228,"# parameters: ",0xe)
      ;
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&local_228,
                          (this->super_StaticAnalyser).paramString_._M_dataplus._M_p,
                          (this->super_StaticAnalyser).paramString_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    }
    if (0 < this->nBins_) {
      local_230 = (local_230 + -1.0) * local_230 * 0.5;
      lVar4 = 0;
      do {
        std::ostream::_M_insert<double>((double)(int)lVar4 * this->deltaTheta_);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_228,"\t",1);
        std::ostream::_M_insert<double>
                  (((double)(this->histogram_).super__Vector_base<int,_std::allocator<int>_>._M_impl
                            .super__Vector_impl_data._M_start[lVar4] / local_230) /
                   (double)this->frameCounter_);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_228,"\n",1);
        lVar4 = lVar4 + 1;
      } while (lVar4 < this->nBins_);
    }
    std::ofstream::close();
  }
  local_228 = _VTT;
  *(undefined8 *)(local_220 + *(long *)(_VTT + -0x18) + -8) = ___throw_bad_array_new_length;
  std::filebuf::~filebuf(local_220);
  std::ios_base::~ios_base(local_130);
  return;
}

Assistant:

void BondAngleDistribution::writeBondAngleDistribution() {
    RealType norm = (RealType)nTotBonds_ * ((RealType)nTotBonds_ - 1.0) / 2.0;

    std::ofstream ofs(getOutputFileName().c_str());

    if (ofs.is_open()) {
      Revision r;

      ofs << "# " << getAnalysisType() << "\n";
      ofs << "# OpenMD " << r.getFullRevision() << "\n";
      ofs << "# " << r.getBuildDate() << "\n";
      ofs << "# selection script: \"" << selectionScript_ << "\"\n";
      if (!paramString_.empty())
        ofs << "# parameters: " << paramString_ << "\n";

      // Normalize by number of frames and write it out:
      for (int i = 0; i < nBins_; ++i) {
        RealType Thetaval = i * deltaTheta_;
        ofs << Thetaval;
        ofs << "\t" << (RealType)histogram_[i] / norm / frameCounter_;
        ofs << "\n";
      }

      ofs.close();

    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "BondAngleDistribution: unable to open %s\n",
               (getOutputFileName() + "q").c_str());
      painCave.isFatal = 1;
      simError();
    }
  }